

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QTableCornerButton::paintEvent(QTableCornerButton *this,QPaintEvent *param_1)

{
  bool bVar1;
  QStyle *pQVar2;
  uint uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  QPainter painter;
  QStyleOptionHeader local_b0;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_b0,0xaa,0x88);
  QStyleOptionHeader::QStyleOptionHeader(&local_b0);
  QStyleOption::initFrom(&local_b0.super_QStyleOption,(QWidget *)this);
  uVar4 = ~((this->super_QAbstractButton).super_QWidget.data)->widget_attributes & 1;
  bVar1 = QWidget::isActiveWindow((QWidget *)this);
  uVar3 = uVar4 + 0x10000;
  if (!bVar1) {
    uVar3 = uVar4;
  }
  bVar1 = QAbstractButton::isDown(&this->super_QAbstractButton);
  local_b0.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)(uVar3 + 4);
  if (!bVar1) {
    local_b0.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)(QFlagsStorageHelper<QStyle::StateFlag,_4>)uVar3
    ;
  }
  local_b0.super_QStyleOption.rect = QWidget::rect((QWidget *)this);
  local_b0.position = OnlyOneSection;
  _painter = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&painter,&(this->super_QAbstractButton).super_QWidget.super_QPaintDevice);
  pQVar2 = QWidget::style((QWidget *)this);
  (**(code **)(*(long *)pQVar2 + 0xb8))(pQVar2,0x17,&local_b0,&painter,this);
  QPainter::~QPainter(&painter);
  QStyleOptionHeader::~QStyleOptionHeader(&local_b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void paintEvent(QPaintEvent*) override {
        QStyleOptionHeader opt;
        opt.initFrom(this);
        QStyle::State state = QStyle::State_None;
        if (isEnabled())
            state |= QStyle::State_Enabled;
        if (isActiveWindow())
            state |= QStyle::State_Active;
        if (isDown())
            state |= QStyle::State_Sunken;
        opt.state = state;
        opt.rect = rect();
        opt.position = QStyleOptionHeader::OnlyOneSection;
        QPainter painter(this);
        style()->drawControl(QStyle::CE_Header, &opt, &painter, this);
    }